

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O0

int __thiscall
x86Argument::Decode(x86Argument *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize,bool x64,
                   bool useMmWord,bool skipSize)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 *local_d0;
  undefined1 *local_c0;
  undefined1 *local_a8;
  undefined1 *local_90;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_58;
  char *local_30;
  char *curr;
  bool skipSize_local;
  bool useMmWord_local;
  bool x64_local;
  uint bufSize_local;
  char *buf_local;
  CodeGenRegVmStateContext *ctx_local;
  x86Argument *this_local;
  
  iVar1 = (int)buf;
  if (this->type == argNumber) {
    if ((ctx->vsAsmStyle & 1U) == 0) {
      if ((uint *)(long)(this->field_1).num == &ctx->callInstructionPos) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.callInstructionPos");
      }
      else if ((char **)(long)(this->field_1).num == &ctx->dataStackTop) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.dataStackTop");
      }
      else if ((CodeGenRegVmCallStackEntry **)(long)(this->field_1).num == &ctx->callStackTop) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.callStackTop");
      }
      else if ((RegVmRegister **)(long)(this->field_1).num == &ctx->regFileLastTop) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.regFileLastTop");
      }
      else if ((RegVmRegister **)(long)(this->field_1).num == &ctx->regFileLastPtr) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.regFileLastPtr");
      }
      else if ((char *)(long)(this->field_1).num == ctx->dataStackBase) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"ctx.dataStackBase");
      }
      else if ((uint *)(long)(this->field_1).num == ctx->ctx->exRegVmConstants) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"ctx.exRegVmConstants");
      }
      else if ((CodeGenRegVmStateContext *)(long)(this->field_1).num == ctx) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx");
      }
      else {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"%d",(ulong)(this->field_1).reg);
      }
    }
    else {
      pcVar4 = "";
      if (9 < (this->field_1).num) {
        pcVar4 = "h";
      }
      iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"%x%s",(ulong)(this->field_1).reg,pcVar4);
    }
    local_30 = buf + iVar2;
  }
  else if (this->type == argReg) {
    if (x64) {
      local_58 = (anonymous_namespace)::x64RegText;
    }
    else {
      local_58 = (anonymous_namespace)::x86RegText;
    }
    strcpy(buf,*(char **)(local_58 + (ulong)(this->field_1).reg * 8));
    sVar3 = strlen(buf);
    local_30 = buf + sVar3;
  }
  else if (this->type == argXmmReg) {
    strcpy(buf,*(char **)((anonymous_namespace)::x86XmmRegText + (ulong)(this->field_1).reg * 8));
    sVar3 = strlen(buf);
    local_30 = buf + sVar3;
  }
  else if (this->type == argLabel) {
    iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"\'0x%x\'",(ulong)(this->field_1).reg);
    local_30 = buf + iVar2;
  }
  else if (this->type == argPtrLabel) {
    iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"[\'0x%x\'+%d]",(ulong)(this->field_1).reg,
                               (ulong)(uint)this->ptrNum);
    local_30 = buf + iVar2;
  }
  else if (this->type == argPtr) {
    local_30 = buf;
    if (!skipSize) {
      if (useMmWord) {
        local_68 = (anonymous_namespace)::x86XmmSizeText;
      }
      else {
        local_68 = (anonymous_namespace)::x86SizeText;
      }
      strcpy(buf,*(char **)(local_68 + (ulong)(this->field_1).reg * 8));
      sVar3 = strlen(buf);
      local_30 = buf + sVar3;
      if ((ctx->vsAsmStyle & 1U) != 0) {
        builtin_strncpy(buf + sVar3," ptr",4);
        local_30 = local_30 + 4;
      }
      *local_30 = ' ';
      local_30 = local_30 + 1;
    }
    pcVar4 = local_30 + 1;
    *local_30 = '[';
    *pcVar4 = '\0';
    local_30 = pcVar4;
    if ((ctx->vsAsmStyle & 1U) == 0) {
      if (this->ptrIndex != rNONE) {
        if (x64) {
          local_78 = (anonymous_namespace)::x64RegText;
        }
        else {
          local_78 = (anonymous_namespace)::x86RegText;
        }
        strcpy(pcVar4,*(char **)(local_78 + (ulong)this->ptrIndex * 8));
        sVar3 = strlen(pcVar4);
        local_30 = pcVar4 + sVar3;
      }
      if (1 < this->ptrMult) {
        iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - ((int)local_30 - iVar1)),"*%d",
                                   (ulong)(uint)this->ptrMult);
        local_30 = local_30 + iVar2;
      }
    }
    if (this->ptrBase != rNONE) {
      iVar2 = (int)local_30;
      if ((ctx->vsAsmStyle & 1U) == 0) {
        if (this->ptrIndex == rNONE) {
          if (x64) {
            local_c0 = (anonymous_namespace)::x64RegText;
          }
          else {
            local_c0 = (anonymous_namespace)::x86RegText;
          }
          iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"%s",
                                     *(undefined8 *)(local_c0 + (ulong)this->ptrBase * 8));
        }
        else {
          if (x64) {
            local_a8 = (anonymous_namespace)::x64RegText;
          }
          else {
            local_a8 = (anonymous_namespace)::x86RegText;
          }
          iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1))," + %s",
                                     *(undefined8 *)(local_a8 + (ulong)this->ptrBase * 8));
        }
      }
      else {
        if (x64) {
          local_90 = (anonymous_namespace)::x64RegText;
        }
        else {
          local_90 = (anonymous_namespace)::x86RegText;
        }
        iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"%s",
                                   *(undefined8 *)(local_90 + (ulong)this->ptrBase * 8));
      }
      local_30 = local_30 + iVar2;
    }
    if ((ctx->vsAsmStyle & 1U) != 0) {
      if (this->ptrIndex != rNONE) {
        if (this->ptrBase != rNONE) {
          *local_30 = '+';
          local_30 = local_30 + 1;
        }
        if (x64) {
          local_d0 = (anonymous_namespace)::x64RegText;
        }
        else {
          local_d0 = (anonymous_namespace)::x86RegText;
        }
        strcpy(local_30,*(char **)(local_d0 + (ulong)this->ptrIndex * 8));
        sVar3 = strlen(local_30);
        local_30 = local_30 + sVar3;
      }
      if (1 < this->ptrMult) {
        iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - ((int)local_30 - iVar1)),"*%d",
                                   (ulong)(uint)this->ptrMult);
        local_30 = local_30 + iVar2;
      }
    }
    iVar2 = (int)local_30;
    if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) && ((ctx->vsAsmStyle & 1U) != 0)) {
      pcVar4 = "";
      if (9 < this->ptrNum) {
        pcVar4 = "h";
      }
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"%x%s",
                                 (ulong)(uint)this->ptrNum,pcVar4);
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((ctx->tempStackArrayBase <= (uint *)(long)this->ptrNum &&
             ((uint *)(long)this->ptrNum < ctx->tempStackArrayEnd)))) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"temp+%u",
                                 (ulong)(uint)(this->ptrNum - (int)ctx->tempStackArrayBase));
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((ctx->dataStackBase <= (char *)(long)this->ptrNum &&
             ((char *)(long)this->ptrNum < ctx->dataStackEnd)))) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"globals+%u",
                                 (ulong)(uint)(this->ptrNum - (int)ctx->dataStackBase));
      local_30 = local_30 + iVar2;
    }
    else if ((((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
             (ctx->ctx->exRegVmConstants <= (uint *)(long)this->ptrNum)) &&
            ((uint *)(long)this->ptrNum < ctx->ctx->exRegVmConstantsEnd)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"constants+%u",
                                 (ulong)(uint)(this->ptrNum - (int)ctx->ctx->exRegVmConstants));
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((uint *)(long)this->ptrNum == &ctx->callInstructionPos)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),
                                 "&ctx.callInstructionPos");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((char **)(long)this->ptrNum == &ctx->dataStackTop)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.dataStackTop");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((CodeGenRegVmCallStackEntry **)(long)this->ptrNum == &ctx->callStackTop)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.callStackTop");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((RegVmRegister **)(long)this->ptrNum == &ctx->regFileLastTop)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.regFileLastTop");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((RegVmRegister **)(long)this->ptrNum == &ctx->regFileLastPtr)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.regFileLastPtr");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((_func_void_CodeGenRegVmStateContext_ptr_uint **)(long)this->ptrNum == &ctx->callWrap))
    {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.callWrap");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((_func_void_CodeGenRegVmStateContext_ptr_uintptr_t_uint **)(long)this->ptrNum ==
             &ctx->checkedReturnWrap)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),
                                 "&ctx.checkedReturnWrap");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((_func_void_CodeGenRegVmStateContext_ptr_uint_uint **)(long)this->ptrNum ==
             &ctx->convertPtrWrap)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"&ctx.convertPtrWrap");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((_func_void_CodeGenRegVmStateContext_ptr **)(long)this->ptrNum ==
             &ctx->errorOutOfBoundsWrap)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),
                                 "&ctx.errorOutOfBoundsWrap");
      local_30 = local_30 + iVar2;
    }
    else if (((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) &&
            ((_func_void_CodeGenRegVmStateContext_ptr **)(long)this->ptrNum ==
             &ctx->errorNoReturnWrap)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),
                                 "&ctx.errorNoReturnWrap");
      local_30 = local_30 + iVar2;
    }
    else if ((this->ptrIndex == rNONE) && (this->ptrBase == rNONE)) {
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"%d",
                                 (ulong)(uint)this->ptrNum);
      local_30 = local_30 + iVar2;
    }
    else if ((this->ptrNum == 0) || ((ctx->vsAsmStyle & 1U) == 0)) {
      if (this->ptrNum != 0) {
        iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"%+d",
                                   (ulong)(uint)this->ptrNum);
        local_30 = local_30 + iVar2;
      }
    }
    else {
      pcVar4 = "";
      if (9 < this->ptrNum) {
        pcVar4 = "h";
      }
      iVar2 = NULLC::SafeSprintf(local_30,(ulong)(bufSize - (iVar2 - iVar1)),"+%x%s",
                                 (ulong)(uint)this->ptrNum,pcVar4);
      local_30 = local_30 + iVar2;
    }
    *local_30 = ']';
    local_30[1] = '\0';
    local_30 = local_30 + 1;
  }
  else {
    local_30 = buf;
    if (this->type == argImm64) {
      if ((CodeGenRegVmStateContext *)(this->field_1).imm64Arg == ctx) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx");
      }
      else if ((uint **)(this->field_1).imm64Arg == &ctx->tempStackArrayBase) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"&ctx.tempStackArrayBase");
      }
      else if ((uint *)(this->field_1).imm64Arg == ctx->tempStackArrayBase) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"ctx.tempStackArrayBase");
      }
      else if ((ctx->vsAsmStyle & 1U) == 0) {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"%lld",(this->field_1).imm64Arg);
      }
      else {
        iVar2 = NULLC::SafeSprintf(buf,(ulong)bufSize,"%llXh",(this->field_1).imm64Arg);
      }
      local_30 = buf + iVar2;
    }
  }
  if (local_30 < buf + bufSize) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0xd2,
                  "int x86Argument::Decode(CodeGenRegVmStateContext &, char *, unsigned int, bool, bool, bool)"
                 );
  }
  return (int)local_30 - iVar1;
}

Assistant:

int x86Argument::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize, bool x64, bool useMmWord, bool skipSize)
{
	char *curr = buf;

	if(type == argNumber)
	{
		if(ctx.vsAsmStyle)
		{
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", num, num > 9 ? "h" : "");
		}
		else
		{
			if(uintptr_t(num) == uintptr_t(&ctx.callInstructionPos))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
			else if(uintptr_t(num) == uintptr_t(&ctx.dataStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.callStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastPtr))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
			else if(uintptr_t(num) == uintptr_t(ctx.dataStackBase))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.dataStackBase");
			else if(uintptr_t(num) == uintptr_t(ctx.ctx->exRegVmConstants))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.exRegVmConstants");
			else if(uintptr_t(num) == uintptr_t(&ctx))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", num);
		}
	}
	else if(type == argReg)
	{
		strcpy(curr, (x64 ? x64RegText : x86RegText)[reg]);
		curr += strlen(curr);
	}
	else if(type == argXmmReg)
	{
		strcpy(curr, x86XmmRegText[xmmArg]);
		curr += strlen(curr);
	}
	else if(type == argLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "'0x%x'", labelID);
	}
	else if(type == argPtrLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "['0x%x'+%d]", labelID, ptrNum);
	}
	else if(type == argPtr)
	{
		if(!skipSize)
		{
			strcpy(curr, (useMmWord ? x86XmmSizeText : x86SizeText)[ptrSize]);
			curr += strlen(curr);

			if(ctx.vsAsmStyle)
			{
				*curr++ = ' ';
				*curr++ = 'p';
				*curr++ = 't';
				*curr++ = 'r';
			}

			*curr++ = ' ';
		}

		*curr++ = '[';
		*curr = 0;

		if(!ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrBase != rNONE)
		{
			if(ctx.vsAsmStyle)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else if(ptrIndex != rNONE)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), " + %s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
		}

		if(ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				if(ptrBase != rNONE)
					*curr++ = '+';

				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrIndex == rNONE && ptrBase == rNONE && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.tempStackArrayBase) && uintptr_t(ptrNum) < uintptr_t(ctx.tempStackArrayEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "temp+%u", unsigned(ptrNum - uintptr_t(ctx.tempStackArrayBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.dataStackBase) && uintptr_t(ptrNum) < uintptr_t(ctx.dataStackEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "globals+%u", unsigned(ptrNum - uintptr_t(ctx.dataStackBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.ctx->exRegVmConstants) && uintptr_t(ptrNum) < uintptr_t(ctx.ctx->exRegVmConstantsEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "constants+%u", unsigned(ptrNum - uintptr_t(ctx.ctx->exRegVmConstants)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callInstructionPos))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.dataStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastPtr))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.checkedReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.checkedReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.convertPtrWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.convertPtrWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorOutOfBoundsWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorOutOfBoundsWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorNoReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorNoReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", ptrNum);
		else if(ptrNum != 0 && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "+%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrNum != 0)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%+d", ptrNum);

		*curr++ = ']';
		*curr = 0;
	}
	else if(type == argImm64)
	{
		if(imm64Arg == uintptr_t(&ctx))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
		else if(imm64Arg == uintptr_t(&ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.tempStackArrayBase");
		else if(imm64Arg == uintptr_t(ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.tempStackArrayBase");
		else if(ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%llXh", (unsigned long long)imm64Arg);
		else
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%lld", (long long)imm64Arg);
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}